

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O0

int lua_loadx(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  int iVar1;
  char *in_RCX;
  long in_RDI;
  int status;
  LexState ls;
  undefined4 in_stack_ffffffffffffff38;
  undefined1 local_c0 [56];
  undefined8 local_88;
  undefined4 local_7c;
  LexState *local_58;
  long local_8;
  
  if ((LexState *)in_RCX == (LexState *)0x0) {
    in_RCX = "?";
  }
  local_88 = 0;
  local_7c = 0;
  local_58 = (LexState *)in_RCX;
  local_8 = in_RDI;
  iVar1 = lj_vm_cpcall(in_RDI,0,local_c0,cpparser);
  lj_lex_cleanup((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffff38),(LexState *)in_RCX);
  if (*(uint *)((ulong)*(uint *)(local_8 + 8) + 0x24) <=
      *(uint *)((ulong)*(uint *)(local_8 + 8) + 0x20)) {
    lj_gc_step((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffff38));
  }
  return iVar1;
}

Assistant:

LUA_API int lua_loadx(lua_State *L, lua_Reader reader, void *data,
		      const char *chunkname, const char *mode)
{
  LexState ls;
  int status;
  ls.rfunc = reader;
  ls.rdata = data;
  ls.chunkarg = chunkname ? chunkname : "?";
  ls.mode = mode;
  lj_str_initbuf(&ls.sb);
  status = lj_vm_cpcall(L, NULL, &ls, cpparser);
  lj_lex_cleanup(L, &ls);
  lj_gc_check(L);
  return status;
}